

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

TCGv_i32 gen_lea_indexed(CPUM68KState_conflict *env,DisasContext_conflict2 *s,TCGv_i32 base)

{
  int iVar1;
  uint uVar2;
  TCGContext_conflict2 *s_00;
  TCGContext_conflict2 *s_01;
  uint uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uintptr_t o;
  TCGTemp *pTVar6;
  TCGv_i32 pTVar7;
  TCGTemp *pTVar8;
  TCGv_i32 pTVar9;
  int32_t arg2;
  uint uVar10;
  TCGContext_conflict2 *tcg_ctx;
  uint16_t ext;
  abi_ptr_conflict aVar11;
  abi_ptr_conflict aVar12;
  uintptr_t o_1;
  TCGv_i32 pTVar13;
  char cVar14;
  uintptr_t o_4;
  uint local_54;
  TCGv_i32 local_50;
  
  s_00 = s->uc->tcg_ctx;
  aVar12 = s->pc;
  uVar4 = cpu_lduw_code_m68k(env,aVar12);
  aVar11 = s->pc + 2;
  s->pc = aVar11;
  uVar10 = s->env->features;
  if (((uVar4 >> 0xb & 1) == 0) && ((uVar10 & 0x8000) == 0)) {
LAB_00700fef:
    return s_00->NULL_QREG;
  }
  uVar3 = uVar4 & 0xfffff9ff;
  if ((uVar10 >> 0x10 & 1) != 0) {
    uVar3 = uVar4;
  }
  if ((uVar10 & 1) == 0) {
    uVar3 = uVar4;
  }
  ext = (uint16_t)uVar3;
  cVar14 = (char)(uVar3 & 0xffff);
  if (((uVar3 & 0xffff) >> 8 & 1) == 0) {
    pTVar6 = tcg_temp_new_internal_m68k(s_00,TCG_TYPE_I32,false);
    iVar1 = s->release_count;
    if ((long)iVar1 < 8) {
      pTVar13 = (TCGv_i32)((long)pTVar6 - (long)s_00);
      s->release_count = iVar1 + 1;
      s->release[iVar1] = pTVar13;
      pTVar7 = gen_addr_index(s,ext,pTVar13);
      if (s_00->NULL_QREG == base) {
        arg2 = (int)cVar14 + aVar12;
      }
      else {
        tcg_gen_op3_m68k(s_00,INDEX_op_add_i32,(TCGArg)pTVar6,(TCGArg)(pTVar7 + (long)s_00),
                         (TCGArg)(base + (long)s_00));
        if (cVar14 == '\0') {
          return pTVar13;
        }
        arg2 = (int32_t)cVar14;
        pTVar7 = pTVar13;
      }
      tcg_gen_addi_i32_m68k(s_00,pTVar13,pTVar7,arg2);
      return pTVar13;
    }
  }
  else {
    if ((uVar10 >> 0xe & 1) == 0) goto LAB_00700fef;
    local_54 = 0;
    if (0x10 < (uVar3 & 0x30)) {
      uVar4 = cpu_lduw_code_m68k(env,aVar11);
      aVar11 = s->pc + 2;
      s->pc = aVar11;
      if ((uVar3 & 0x30) == 0x20) {
        local_54 = (int)(uVar4 << 0x10) >> 0x10;
      }
      else {
        uVar5 = cpu_lduw_code_m68k(env,aVar11);
        s->pc = s->pc + 2;
        local_54 = uVar4 << 0x10 | uVar5 & 0xffff;
      }
    }
    pTVar6 = tcg_temp_new_internal_m68k(s_00,TCG_TYPE_I32,false);
    iVar1 = s->release_count;
    if ((long)iVar1 < 8) {
      pTVar7 = (TCGv_i32)((long)pTVar6 - (long)s_00);
      s->release_count = iVar1 + 1;
      s->release[iVar1] = pTVar7;
      if ((uVar3 & 0x44) == 0) {
        pTVar13 = gen_addr_index(s,ext,pTVar7);
      }
      else {
        pTVar13 = s_00->NULL_QREG;
      }
      local_50 = pTVar13;
      if (-1 < cVar14) {
        pTVar9 = s_00->NULL_QREG;
        local_50 = base;
        if (pTVar9 == base) {
          local_50 = tcg_const_i32_m68k(s_00,local_54 + aVar12);
          iVar1 = s->release_count;
          if (7 < (long)iVar1) goto LAB_0070139c;
          s->release_count = iVar1 + 1;
          s->release[iVar1] = local_50;
          pTVar9 = s_00->NULL_QREG;
          local_54 = 0;
        }
        if (pTVar13 != pTVar9) {
          tcg_gen_op3_m68k(s_00,INDEX_op_add_i32,(TCGArg)pTVar6,(TCGArg)(pTVar13 + (long)s_00),
                           (TCGArg)(local_50 + (long)s_00));
          local_50 = pTVar7;
        }
      }
      if (local_50 == s_00->NULL_QREG) {
        local_50 = tcg_const_i32_m68k(s_00,local_54);
        iVar1 = s->release_count;
        if (7 < (long)iVar1) goto LAB_0070139c;
        s->release_count = iVar1 + 1;
        s->release[iVar1] = local_50;
      }
      else if (local_54 != 0) {
        tcg_gen_addi_i32_m68k(s_00,pTVar7,local_50,local_54);
        local_50 = pTVar7;
      }
      uVar10 = uVar3 & 3;
      if (uVar10 == 0) {
        return local_50;
      }
      uVar2 = ((s->base).tb)->flags;
      s_01 = s->uc->tcg_ctx;
      pTVar8 = tcg_temp_new_internal_m68k(s_01,TCG_TYPE_I32,false);
      pTVar13 = (TCGv_i32)((long)pTVar8 - (long)s_01);
      tcg_gen_qemu_ld_i32_m68k(s_01,pTVar13,local_50,(ulong)((uVar2 >> 0xd & 1) == 0),MO_BEUL);
      iVar1 = s->release_count;
      if ((long)iVar1 < 8) {
        s->release_count = iVar1 + 1;
        s->release[iVar1] = pTVar13;
        if ((uVar3 & 0x44) == 4) {
          pTVar9 = gen_addr_index(s,ext,pTVar7);
          tcg_gen_op3_m68k(s_00,INDEX_op_add_i32,(TCGArg)pTVar6,(TCGArg)(pTVar9 + (long)s_00),
                           (TCGArg)(pTVar13 + (long)s_00));
          pTVar13 = pTVar7;
        }
        if (uVar10 == 1) {
          return pTVar13;
        }
        if (uVar10 == 2) {
          uVar4 = cpu_lduw_code_m68k(env,s->pc);
          s->pc = s->pc + 2;
          uVar10 = (uint)(short)uVar4;
        }
        else {
          uVar4 = cpu_lduw_code_m68k(env,s->pc);
          aVar12 = s->pc + 2;
          s->pc = aVar12;
          uVar5 = cpu_lduw_code_m68k(env,aVar12);
          s->pc = s->pc + 2;
          uVar10 = uVar5 & 0xffff | uVar4 << 0x10;
        }
        if (uVar10 == 0) {
          return pTVar13;
        }
        tcg_gen_addi_i32_m68k(s_00,pTVar7,pTVar13,uVar10);
        return pTVar7;
      }
    }
  }
LAB_0070139c:
  g_assertion_message_expr
            ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/m68k/translate.c"
             ,0x91,"s->release_count < MAX_TO_RELEASE");
}

Assistant:

static TCGv gen_lea_indexed(CPUM68KState *env, DisasContext *s, TCGv base)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    uint32_t offset;
    uint16_t ext;
    TCGv add;
    TCGv tmp;
    uint32_t bd, od;

    offset = s->pc;
    ext = read_im16(env, s);

    if ((ext & 0x800) == 0 && !m68k_feature(s->env, M68K_FEATURE_WORD_INDEX))
        return tcg_ctx->NULL_QREG;

    if (m68k_feature(s->env, M68K_FEATURE_M68000) &&
        !m68k_feature(s->env, M68K_FEATURE_SCALED_INDEX)) {
        ext &= ~(3 << 9);
    }

    if (ext & 0x100) {
        /* full extension word format */
        if (!m68k_feature(s->env, M68K_FEATURE_EXT_FULL))
            return tcg_ctx->NULL_QREG;

        if ((ext & 0x30) > 0x10) {
            /* base displacement */
            if ((ext & 0x30) == 0x20) {
                bd = (int16_t)read_im16(env, s);
            } else {
                bd = read_im32(env, s);
            }
        } else {
            bd = 0;
        }
        tmp = mark_to_release(s, tcg_temp_new(tcg_ctx));
        if ((ext & 0x44) == 0) {
            /* pre-index */
            add = gen_addr_index(s, ext, tmp);
        } else {
            add = tcg_ctx->NULL_QREG;
        }
        if ((ext & 0x80) == 0) {
            /* base not suppressed */
            if (IS_NULL_QREG(base)) {
                base = mark_to_release(s, tcg_const_i32(tcg_ctx, offset + bd));
                bd = 0;
            }
            if (!IS_NULL_QREG(add)) {
                tcg_gen_add_i32(tcg_ctx, tmp, add, base);
                add = tmp;
            } else {
                add = base;
            }
        }
        if (!IS_NULL_QREG(add)) {
            if (bd != 0) {
                tcg_gen_addi_i32(tcg_ctx, tmp, add, bd);
                add = tmp;
            }
        } else {
            add = mark_to_release(s, tcg_const_i32(tcg_ctx, bd));
        }
        if ((ext & 3) != 0) {
            /* memory indirect */
            base = mark_to_release(s, gen_load(s, OS_LONG, add, 0, IS_USER(s)));
            if ((ext & 0x44) == 4) {
                add = gen_addr_index(s, ext, tmp);
                tcg_gen_add_i32(tcg_ctx, tmp, add, base);
                add = tmp;
            } else {
                add = base;
            }
            if ((ext & 3) > 1) {
                /* outer displacement */
                if ((ext & 3) == 2) {
                    od = (int16_t)read_im16(env, s);
                } else {
                    od = read_im32(env, s);
                }
            } else {
                od = 0;
            }
            if (od != 0) {
                tcg_gen_addi_i32(tcg_ctx, tmp, add, od);
                add = tmp;
            }
        }
    } else {
        /* brief extension word format */
        tmp = mark_to_release(s, tcg_temp_new(tcg_ctx));
        add = gen_addr_index(s, ext, tmp);
        if (!IS_NULL_QREG(base)) {
            tcg_gen_add_i32(tcg_ctx, tmp, add, base);
            if ((int8_t)ext)
                tcg_gen_addi_i32(tcg_ctx, tmp, tmp, (int8_t)ext);
        } else {
            tcg_gen_addi_i32(tcg_ctx, tmp, add, offset + (int8_t)ext);
        }
        add = tmp;
    }
    return add;
}